

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O1

bool __thiscall mp::StringFileWriter::Open(StringFileWriter *this)

{
  FILE *__stream;
  undefined8 local_18;
  
  this->fTriedOpen_ = true;
  if ((this->opener_).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->opener_)._M_invoker)((_Any_data *)&stack0xffffffffffffffe8,(bool *)&this->opener_);
    __stream = (FILE *)(this->nm).f_;
    (this->nm).f_ = (FILE *)local_18;
    if (__stream != (FILE *)0x0) {
      local_18 = __stream;
      fclose(__stream);
    }
    return (this->nm).f_ != (FILE *)0x0;
  }
  std::__throw_bad_function_call();
}

Assistant:

bool Open() {
    fTriedOpen_ = true;
    nm = opener_(false);
    return nm;
  }